

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O0

void __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::~OPTPFor
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  void *in_RDI;
  
  ~OPTPFor((OPTPFor<4U,_FastPForLib::Simple16<false>_> *)0x14f118);
  operator_delete(in_RDI);
  return;
}

Assistant:

OPTPFor() {}